

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O0

void put_LZW_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  long in_RSI;
  long in_RDI;
  hash_entry probe_value;
  hash_int disp;
  hash_int i;
  code_int c;
  JDIMENSION col;
  JSAMPROW ptr;
  gif_dest_ptr dest;
  code_int in_stack_ffffffffffffffbe;
  undefined4 in_stack_ffffffffffffffc0;
  int local_38;
  int local_34;
  int local_2c;
  byte *local_28;
  
  local_2c = *(int *)(in_RDI + 0x88);
  local_28 = (byte *)**(undefined8 **)(in_RSI + 0x28);
  do {
    if (local_2c == 0) {
      return;
    }
    uVar2 = (ushort)*local_28;
    if (*(int *)(in_RSI + 0x58) == 0) {
      local_34 = (short)uVar2 * 0x10 + (int)*(short *)(in_RSI + 0x54);
      if (0x138a < local_34) {
        local_34 = local_34 + -0x138b;
      }
      uVar3 = (int)*(short *)(in_RSI + 0x54) << 8 | (int)(short)uVar2;
      if (*(short *)(*(long *)(in_RSI + 0x68) + (long)local_34 * 2) == 0) {
        output((gif_dest_ptr)CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbe);
        if (*(short *)(in_RSI + 0x60) < 0x1000) {
          sVar1 = *(short *)(in_RSI + 0x60);
          *(short *)(in_RSI + 0x60) = sVar1 + 1;
          *(short *)(*(long *)(in_RSI + 0x68) + (long)local_34 * 2) = sVar1;
          *(uint *)(*(long *)(in_RSI + 0x70) + (long)local_34 * 4) = uVar3;
        }
        else {
          clear_block((gif_dest_ptr)0x108d70);
        }
        *(ushort *)(in_RSI + 0x54) = uVar2;
      }
      else if (*(uint *)(*(long *)(in_RSI + 0x70) + (long)local_34 * 4) == uVar3) {
        *(undefined2 *)(in_RSI + 0x54) =
             *(undefined2 *)(*(long *)(in_RSI + 0x68) + (long)local_34 * 2);
      }
      else {
        if (local_34 == 0) {
          local_38 = 1;
        }
        else {
          local_38 = 0x138b - local_34;
        }
        do {
          local_34 = local_34 - local_38;
          if (local_34 < 0) {
            local_34 = local_34 + 0x138b;
          }
          if (*(short *)(*(long *)(in_RSI + 0x68) + (long)local_34 * 2) == 0) {
            output((gif_dest_ptr)CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbe
                  );
            if (*(short *)(in_RSI + 0x60) < 0x1000) {
              sVar1 = *(short *)(in_RSI + 0x60);
              *(short *)(in_RSI + 0x60) = sVar1 + 1;
              *(short *)(*(long *)(in_RSI + 0x68) + (long)local_34 * 2) = sVar1;
              *(uint *)(*(long *)(in_RSI + 0x70) + (long)local_34 * 4) = uVar3;
            }
            else {
              clear_block((gif_dest_ptr)0x108e7d);
            }
            *(ushort *)(in_RSI + 0x54) = uVar2;
            goto LAB_00108ec8;
          }
        } while (*(uint *)(*(long *)(in_RSI + 0x70) + (long)local_34 * 4) != uVar3);
        *(undefined2 *)(in_RSI + 0x54) =
             *(undefined2 *)(*(long *)(in_RSI + 0x68) + (long)local_34 * 2);
      }
    }
    else {
      *(ushort *)(in_RSI + 0x54) = uVar2;
      *(undefined4 *)(in_RSI + 0x58) = 0;
    }
LAB_00108ec8:
    local_2c = local_2c + -1;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

METHODDEF(void)
put_LZW_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                   JDIMENSION rows_supplied)
{
  gif_dest_ptr dest = (gif_dest_ptr)dinfo;
  register JSAMPROW ptr;
  register JDIMENSION col;
  code_int c;
  register hash_int i;
  register hash_int disp;
  register hash_entry probe_value;

  ptr = dest->pub.buffer[0];
  for (col = cinfo->output_width; col > 0; col--) {
    /* Accept and compress one 8-bit byte */
    c = (code_int)(*ptr++);

    if (dest->first_byte) {     /* need to initialize waiting_code */
      dest->waiting_code = c;
      dest->first_byte = FALSE;
      continue;
    }

    /* Probe hash table to see if a symbol exists for
     * waiting_code followed by c.
     * If so, replace waiting_code by that symbol and continue.
     */
    i = ((hash_int)c << (MAX_LZW_BITS - 8)) + dest->waiting_code;
    /* i is less than twice 2**MAX_LZW_BITS, therefore less than twice HSIZE */
    if (i >= HSIZE)
      i -= HSIZE;

    probe_value = HASH_ENTRY(dest->waiting_code, c);

    if (dest->hash_code[i] == 0) {
      /* hit empty slot; desired symbol not in table */
      output(dest, dest->waiting_code);
      if (dest->free_code < LZW_TABLE_SIZE) {
        dest->hash_code[i] = dest->free_code++; /* add symbol to hashtable */
        dest->hash_value[i] = probe_value;
      } else
        clear_block(dest);
      dest->waiting_code = c;
      continue;
    }
    if (dest->hash_value[i] == probe_value) {
      dest->waiting_code = dest->hash_code[i];
      continue;
    }

    if (i == 0)                 /* secondary hash (after G. Knott) */
      disp = 1;
    else
      disp = HSIZE - i;
    for (;;) {
      i -= disp;
      if (i < 0)
        i += HSIZE;
      if (dest->hash_code[i] == 0) {
        /* hit empty slot; desired symbol not in table */
        output(dest, dest->waiting_code);
        if (dest->free_code < LZW_TABLE_SIZE) {
          dest->hash_code[i] = dest->free_code++; /* add symbol to hashtable */
          dest->hash_value[i] = probe_value;
        } else
          clear_block(dest);
        dest->waiting_code = c;
        break;
      }
      if (dest->hash_value[i] == probe_value) {
        dest->waiting_code = dest->hash_code[i];
        break;
      }
    }
  }
}